

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O1

void Eigen::internal::
     visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_21>
     ::run(visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *mat,
          max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_> *visitor)

{
  Scalar *pSVar1;
  float fVar2;
  Scalar *pSVar3;
  
  visitor_impl<Eigen::internal::max_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_Eigen::internal::visitor_evaluator<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>,_11>
  ::run(mat,visitor);
  pSVar3 = (mat->m_evaluator).
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>_>.m_data;
  fVar2 = pSVar3[0xb];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0xb;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0xc];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0xc;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0xd];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0xd;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0xe];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0xe;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0xf];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0xf;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0x10];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x10;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0x11];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x11;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0x12];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x12;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0x13];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x13;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  fVar2 = pSVar3[0x14];
  pSVar1 = &(visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res;
  if (*pSVar1 <= fVar2 && fVar2 != *pSVar1) {
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).res = fVar2;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).row = 0x14;
    (visitor->super_coeff_visitor<Eigen::Matrix<float,_32,_1,_0,_32,_1>_>).col = 0;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
  static inline void run(const Derived &mat, Visitor& visitor)
  {
    visitor_impl<Visitor, Derived, UnrollCount-1>::run(mat, visitor);
    visitor(mat.coeff(row, col), row, col);
  }